

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf_rule
          (CycleBreaking<covenant::Sym> *this,CFG *g,int lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rule,
          unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
          *new_non_terminals,set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  const_reference pvVar5;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  *puVar6;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_RCX;
  int in_EDX;
  CFG *in_RSI;
  uint i_1;
  Rule new_rr;
  int prev_nt;
  uint i;
  Rule new_r;
  bool finished;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> terminal_symbols;
  int curr_nt;
  CFG *in_stack_fffffffffffffe48;
  Rule *in_stack_fffffffffffffe50;
  CFG *in_stack_fffffffffffffe60;
  CFG *in_stack_fffffffffffffe68;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  *in_stack_fffffffffffffe70;
  Sym LHS;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffe78;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_stack_fffffffffffffe80;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *r;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  uint local_fc;
  set<int,_std::less<int>,_std::allocator<int>_> local_f8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  uint local_a4;
  byte local_51;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_50;
  int local_34;
  int local_14;
  CFG *local_10;
  
  local_34 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)0x233a58);
  local_51 = findNextNonTerminal((CycleBreaking<covenant::Sym> *)
                                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                                 in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                                 in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
  CFG::getTermFactory(in_stack_fffffffffffffe48);
  Rule::Rule(in_stack_fffffffffffffe50,(TermFactory *)in_stack_fffffffffffffe48);
  boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)0x233ad6);
  for (local_a4 = 0; uVar1 = (ulong)local_a4,
      sVar2 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_50),
      uVar1 < sVar2; local_a4 = local_a4 + 1) {
    pvVar3 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                       (&local_50,(ulong)local_a4);
    local_a8 = pvVar3->x;
    Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                     (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  }
  if ((local_51 & 1) == 0) {
    pvVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                       (in_RCX,(long)local_34);
    local_b8 = pvVar5->x;
    Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                     (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    local_bc = (int)Sym::mkVar(local_14);
    CFG::prod(in_stack_fffffffffffffe68,(Sym)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
              (Rule *)in_stack_fffffffffffffe60);
    local_c0 = local_34;
    local_34 = local_34 + 1;
    do {
      if (((local_51 ^ 0xff) & 1) == 0) break;
      r = &local_50;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::clear
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)0x233cf7);
      in_stack_fffffffffffffe8f =
           findNextNonTerminal((CycleBreaking<covenant::Sym> *)
                               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),r,
                               in_stack_fffffffffffffe78,
                               (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                               in_stack_fffffffffffffe70,(int *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe78 = &local_f8;
      local_51 = in_stack_fffffffffffffe8f;
      CFG::getTermFactory(in_stack_fffffffffffffe48);
      Rule::Rule(in_stack_fffffffffffffe50,(TermFactory *)in_stack_fffffffffffffe48);
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x233d6c);
      local_fc = 0;
      while( true ) {
        in_stack_fffffffffffffe70 =
             (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
              *)(ulong)local_fc;
        puVar6 = (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                  *)std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_50);
        if (puVar6 <= in_stack_fffffffffffffe70) break;
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                  (&local_50,(ulong)local_fc);
        Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                         (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        local_fc = local_fc + 1;
      }
      if ((local_51 & 1) == 0) {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                  (in_RCX,(long)local_34);
        Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                         (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        in_stack_fffffffffffffe60 = local_10;
        pvVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                           (in_RCX,(long)local_c0);
        Sym::symID(pvVar5);
        in_stack_fffffffffffffe68 =
             (CFG *)boost::unordered::
                    unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                    ::operator[](in_stack_fffffffffffffe70,
                                 (key_type_conflict *)in_stack_fffffffffffffe68);
        CFG::prod(in_stack_fffffffffffffe68,(Sym)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  (Rule *)in_stack_fffffffffffffe60);
        local_c0 = local_34;
        local_34 = local_34 + 1;
        local_b4 = 0;
      }
      else {
        boost::unordered::
        unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
        ::operator[](in_stack_fffffffffffffe70,(key_type_conflict *)in_stack_fffffffffffffe68);
        Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                         (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        in_stack_fffffffffffffe48 = local_10;
        pvVar5 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                           (in_RCX,(long)local_c0);
        Sym::symID(pvVar5);
        in_stack_fffffffffffffe50 =
             (Rule *)boost::unordered::
                     unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                     ::operator[](in_stack_fffffffffffffe70,
                                  (key_type_conflict *)in_stack_fffffffffffffe68);
        CFG::prod(in_stack_fffffffffffffe68,(Sym)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  (Rule *)in_stack_fffffffffffffe60);
        local_b4 = 6;
      }
      Rule::~Rule(in_stack_fffffffffffffe50);
    } while (local_b4 == 0);
    local_b4 = 0;
  }
  else {
    pmVar4 = boost::unordered::
             unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
             ::operator[](in_stack_fffffffffffffe70,(key_type_conflict *)in_stack_fffffffffffffe68);
    LHS.x = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    local_ac = pmVar4->x;
    Rule::operator<<((Rule *)in_stack_fffffffffffffe48,
                     (Sym)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    local_b0 = (int)Sym::mkVar(local_14);
    CFG::prod(in_stack_fffffffffffffe68,LHS,(Rule *)in_stack_fffffffffffffe60);
    local_b4 = 1;
  }
  Rule::~Rule(in_stack_fffffffffffffe50);
  std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
            ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void cycle_breaking_transf_rule (CFG &g, 
                                   const int lhs, 
                                   const vector<EdgeSym> rule, 
                                   boost::unordered_map<int, EdgeSym> new_non_terminals,
                                   const set<int> group_set)
  {
    int curr_nt=0;
    vector<EdgeSym> terminal_symbols;
    bool finished = findNextNonTerminal (rule, group_set, 
                                         terminal_symbols, curr_nt);
    Rule new_r (g.getTermFactory ());
    for(unsigned i=0; i< terminal_symbols.size(); i++)
      new_r << terminal_symbols[i];
      
    if (finished)
    {
      // the rule has only terminal symbols
      new_r << new_non_terminals[lhs];
      g.prod(EdgeSym::mkVar(lhs), new_r);

      // LOG ("abstraction", 
      //      cout << "\t\trule only with terminal symbols: ";
      //      g.printProduction(cout, lhs); cout << endl);

      return;
    }
    else
    {
      // we found the first nonterminal symbol
      new_r << rule[curr_nt];
      g.prod(EdgeSym::mkVar(lhs), new_r);	

      // LOG ("abstraction" , 
      //      cout << "\t\tAdded rule from first nonterminal: ";
      //      g.printProduction(cout, lhs); cout << endl);

    }
    int prev_nt = curr_nt;
    curr_nt++;
    while (!finished)
    {
      terminal_symbols.clear();
      finished = findNextNonTerminal(rule, group_set, 
                                     terminal_symbols, curr_nt);
      Rule new_rr (g.getTermFactory ());
      for(unsigned i=0; i< terminal_symbols.size(); i++)
        new_rr << terminal_symbols[i];
      if (!finished)
      {
        // intermediate non terminal symbol
        new_rr << rule[curr_nt];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tintermediate nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        prev_nt = curr_nt;
        curr_nt++;
      }
      else
      {
        // last non terminal symbol
        new_rr << new_non_terminals[lhs];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tlast nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        break;
      }
    }
  }